

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode UA_Client_connect(UA_Client *client,char *endpointUrl)

{
  UA_UInt32 *__s;
  UA_UserTokenPolicy *pUVar1;
  UA_Logger logger;
  UA_ConnectionConfig UVar2;
  UA_UInt32 UVar3;
  UA_UInt32 UVar4;
  UA_UInt32 UVar5;
  UA_Boolean UVar6;
  UA_StatusCode UVar7;
  undefined4 extraout_var;
  UA_EndpointDescription *pUVar8;
  UA_String *pUVar9;
  UA_String *dst;
  char *pcVar10;
  long lVar11;
  long lVar12;
  UA_EndpointDescription *p;
  size_t sVar13;
  UA_EndpointDescription *size;
  byte bVar14;
  bool bVar15;
  UA_String UVar16;
  undefined1 local_2e8 [8];
  UA_CreateSessionResponse response;
  UA_String securityNone;
  UA_String local_c8 [2];
  UA_ByteString local_a8 [2];
  undefined8 local_88;
  undefined4 local_80;
  UA_EndpointDescription *local_78;
  UA_EndpointDescription *endpointArray;
  size_t endpointArraySize;
  UA_String *local_60;
  UA_EndpointDescription *local_58;
  UA_EndpointDescription *local_50;
  undefined8 local_48;
  UA_Client *local_40;
  UA_String *local_38;
  
  if (client->state == UA_CLIENTSTATE_CONNECTED) {
LAB_00123590:
    UVar7 = 0;
  }
  else {
    if (client->state == UA_CLIENTSTATE_ERRORED) {
      UA_Client_reset(client);
    }
    UVar2.recvBufferSize = 0xffff;
    UVar2.maxMessageSize = 0;
    UVar2.protocolVersion = 0;
    UVar2.sendBufferSize = 0xffff;
    UVar2.maxChunkCount = 0;
    (*(client->config).connectionFunc)
              ((UA_Connection *)&response.maxRequestMessageSize,UVar2,endpointUrl,
               (client->config).logger);
    memcpy(&client->connection,&response.maxRequestMessageSize,0x88);
    UVar7 = 0x80ae0000;
    if ((client->connection).state == UA_CONNECTION_OPENING) {
      UVar16 = UA_String_fromChars(endpointUrl);
      client->endpointUrl = UVar16;
      if (UVar16.data == (UA_Byte *)0x0) {
        UVar7 = 0x80030000;
      }
      else {
        (client->connection).localConf.maxChunkCount =
             (client->config).localConnectionConfig.maxChunkCount;
        UVar3 = (client->config).localConnectionConfig.sendBufferSize;
        UVar4 = (client->config).localConnectionConfig.recvBufferSize;
        UVar5 = (client->config).localConnectionConfig.maxMessageSize;
        (client->connection).localConf.protocolVersion =
             (client->config).localConnectionConfig.protocolVersion;
        (client->connection).localConf.sendBufferSize = UVar3;
        (client->connection).localConf.recvBufferSize = UVar4;
        (client->connection).localConf.maxMessageSize = UVar5;
        UVar7 = HelAckHandshake(client);
        if ((UVar7 == 0) && (UVar7 = SecureChannelHandshake(client,false), UVar7 == 0)) {
          local_78 = (UA_EndpointDescription *)0x0;
          endpointArray = (UA_EndpointDescription *)0x0;
          UVar7 = GetEndpoints(client,(size_t *)&endpointArray,&local_78);
          if (UVar7 == 0) {
            local_60 = &client->endpointUrl;
            join_0x00000010_0x00000000_ =
                 UA_STRING("http://opcfoundation.org/UA/SecurityPolicy#None");
            _local_2e8 = UA_STRING(
                                  "http://opcfoundation.org/UA-Profile/Transport/uatcp-uasc-uabinary"
                                  );
            local_38 = &(client->token).policyId;
            bVar14 = 0;
            local_48 = 0;
            local_58 = endpointArray;
            local_50 = local_78;
            pUVar8 = (UA_EndpointDescription *)0x0;
            p = local_78;
            size = endpointArray;
            local_40 = client;
            while (pUVar8 != size) {
              endpointArraySize = (size_t)pUVar8;
              if ((p[(long)pUVar8].transportProfileUri.length == 0) ||
                 (UVar6 = UA_String_equal(&p[(long)pUVar8].transportProfileUri,
                                          (UA_String *)local_2e8), UVar6)) {
                UVar6 = UA_String_equal(&p[(long)pUVar8].securityPolicyUri,
                                        (UA_String *)&response.maxRequestMessageSize);
                if (UVar6) {
                  sVar13 = p[(long)pUVar8].userIdentityTokensSize;
                  lVar11 = 0x38;
                  lVar12 = 0;
                  while (bVar15 = sVar13 != 0, sVar13 = sVar13 - 1, bVar15) {
                    pUVar1 = p[(long)pUVar8].userIdentityTokens;
                    if (((*(long *)((long)&(pUVar1->policyId).length + lVar11) == 0) ||
                        (UVar6 = UA_String_equal((UA_String *)
                                                 ((long)&(pUVar1->policyId).length + lVar11),
                                                 (UA_String *)&response.maxRequestMessageSize),
                        UVar6)) &&
                       (local_40->authenticationMethod ==
                        *(UA_Client_Authentication *)((long)pUVar1 + lVar11 + -0x28))) {
                      UVar7 = UA_copy((void *)((long)pUVar1 - lVar12),local_38,UA_TYPES + 0x65);
                      local_48 = CONCAT71((int7)(CONCAT44(extraout_var,UVar7) >> 8),1);
                      break;
                    }
                    lVar12 = lVar12 + -0x48;
                    lVar11 = lVar11 + 0x48;
                  }
                  bVar14 = 1;
                  client = local_40;
                  p = local_50;
                  size = local_58;
                }
              }
              pUVar8 = (UA_EndpointDescription *)(endpointArraySize + 1);
            }
            UA_Array_delete(p,(size_t)size,UA_TYPES + 0x9b);
            if (((byte)local_48 & bVar14) == 0) {
              pcVar10 = "No suitable endpoint found";
              if (bVar14 != 0) {
                pcVar10 = "No suitable UserTokenPolicy found for the possible endpoints";
              }
              UA_LOG_ERROR((client->config).logger,UA_LOGCATEGORY_CLIENT,pcVar10);
              UVar7 = 0x80020000;
            }
            else {
              __s = &response.maxRequestMessageSize;
              memset(__s,0,0x148);
              UA_DateTime_now();
              UA_ByteString_copy(&(client->channel).clientNonce,local_a8);
              local_88 = 0x41324f8000000000;
              local_80 = 0x7fffffff;
              UA_String_copy(local_60,local_c8);
              memset(local_2e8,0,0x128);
              __UA_Client_Service(client,__s,UA_TYPES + 0x99,local_2e8,UA_TYPES + 0xa1);
              UA_NodeId_copy((UA_NodeId *)((long)&response.sessionId.identifier + 8),
                             &client->authenticationToken);
              UVar7 = response.responseHeader.timestamp._4_4_;
              UA_deleteMembers(__s,UA_TYPES + 0x99);
              UA_deleteMembers(local_2e8,UA_TYPES + 0xa1);
              if (UVar7 == 0) {
                memset(&response.maxRequestMessageSize,0,0x100);
                client->requestHandle = client->requestHandle + 1;
                UA_DateTime_now();
                if (client->authenticationMethod == UA_CLIENTAUTHENTICATION_NONE) {
                  dst = (UA_String *)UA_new(UA_TYPES + 0x2d);
                  dst->length = 0;
                  dst->data = (UA_Byte *)0x0;
                  pUVar9 = local_38;
                }
                else {
                  pUVar9 = (UA_String *)UA_new(UA_TYPES + 0x50);
                  pUVar9->length = 0;
                  pUVar9->data = (UA_Byte *)0x0;
                  pUVar9[1].length = 0;
                  pUVar9[1].data = (UA_Byte *)0x0;
                  pUVar9[2].length = 0;
                  pUVar9[2].data = (UA_Byte *)0x0;
                  pUVar9[3].length = 0;
                  pUVar9[3].data = (UA_Byte *)0x0;
                  dst = pUVar9 + 2;
                  UA_String_copy(local_38,pUVar9);
                  UA_String_copy(&client->username,pUVar9 + 1);
                  pUVar9 = &client->password;
                }
                UA_String_copy(pUVar9,dst);
                __UA_Client_Service(client,&response.maxRequestMessageSize,UA_TYPES + 0x53,local_2e8
                                    ,UA_TYPES + 0x58);
                if (response.responseHeader.timestamp._4_4_ == 0) {
                  UVar7 = 0;
                }
                else {
                  logger = (client->config).logger;
                  pcVar10 = UA_StatusCode_name(response.responseHeader.timestamp._4_4_);
                  UA_LOG_ERROR(logger,UA_LOGCATEGORY_CLIENT,
                               "ActivateSession failed with error code %s",pcVar10);
                  UVar7 = response.responseHeader.timestamp._4_4_;
                }
                UA_deleteMembers(&response.maxRequestMessageSize,UA_TYPES + 0x53);
                UA_deleteMembers(local_2e8,UA_TYPES + 0x58);
                if (UVar7 == 0) {
                  (client->connection).state = UA_CONNECTION_ESTABLISHED;
                  client->state = UA_CLIENTSTATE_CONNECTED;
                  goto LAB_00123590;
                }
              }
            }
          }
        }
      }
    }
    UA_Client_reset(client);
  }
  return UVar7;
}

Assistant:

UA_StatusCode
UA_Client_connect(UA_Client *client, const char *endpointUrl) {
    if(client->state == UA_CLIENTSTATE_CONNECTED)
        return UA_STATUSCODE_GOOD;
    if(client->state == UA_CLIENTSTATE_ERRORED) {
        UA_Client_reset(client);
    }

    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    client->connection =
        client->config.connectionFunc(UA_ConnectionConfig_standard,
                                      endpointUrl, client->config.logger);
    if(client->connection.state != UA_CONNECTION_OPENING) {
        retval = UA_STATUSCODE_BADCONNECTIONCLOSED;
        goto cleanup;
    }

    client->endpointUrl = UA_STRING_ALLOC(endpointUrl);
    if(!client->endpointUrl.data) {
        retval = UA_STATUSCODE_BADOUTOFMEMORY;
        goto cleanup;
    }

    client->connection.localConf = client->config.localConnectionConfig;
    retval = HelAckHandshake(client);
    if(retval == UA_STATUSCODE_GOOD)
        retval = SecureChannelHandshake(client, false);
    if(retval == UA_STATUSCODE_GOOD)
        retval = EndpointsHandshake(client);
    if(retval == UA_STATUSCODE_GOOD)
        retval = SessionHandshake(client);
    if(retval == UA_STATUSCODE_GOOD)
        retval = ActivateSession(client);
    if(retval == UA_STATUSCODE_GOOD) {
        client->connection.state = UA_CONNECTION_ESTABLISHED;
        client->state = UA_CLIENTSTATE_CONNECTED;
    } else {
        goto cleanup;
    }
    return retval;

 cleanup:
    UA_Client_reset(client);
    return retval;
}